

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 in_RSI;
  int in_EDI;
  void *unaff_retaddr;
  int sensi_meth;
  int err_con;
  int sensi;
  N_Vector *uS;
  int *plist;
  int is;
  sunrealtype *pbar;
  int retval;
  int iout;
  N_Vector y;
  sunrealtype tout;
  sunrealtype t;
  sunrealtype reltol;
  sunrealtype abstol;
  UserData data;
  SUNLinearSolver LS;
  void *cvode_mem;
  SUNContext sunctx;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  N_Vector y_00;
  void *__ptr;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  void *__ptr_00;
  undefined4 in_stack_ffffffffffffffa4;
  double local_50;
  undefined1 local_48 [8];
  undefined8 local_40;
  undefined8 local_38;
  UserData local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  int sensi_meth_00;
  int sensi_00;
  
  sensi_00 = 0;
  __ptr_00 = (void *)0x0;
  __ptr = (void *)0x0;
  y_00 = (N_Vector)0x0;
  local_30 = (UserData)0x0;
  local_20 = 0;
  local_28 = 0;
  ProcessArgs(0,(char **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
              (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
              (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),(int *)0x102583);
  local_30 = AllocUserData();
  iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    InitUserData(local_30);
    uVar2 = SUNContext_Create(0,&local_18);
    iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      uVar4 = N_VNew_Serial(0x1c2,local_18);
      iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           in_stack_ffffffffffffff6c);
      if (iVar1 == 0) {
        SetInitialProfiles((N_Vector)CONCAT44(in_stack_ffffffffffffffa4,uVar2),(sunrealtype)__ptr_00
                           ,(sunrealtype)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        local_38 = 0x3f50624dd2f1a9fc;
        local_40 = 0x3ee4f8b588e368f1;
        local_20 = CVodeCreate(2,local_18);
        iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             in_stack_ffffffffffffff6c);
        if (iVar1 == 0) {
          CVodeSetUserData(local_20,local_30);
          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                               ,(char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70
                                                ),in_stack_ffffffffffffff6c);
          if (iVar1 == 0) {
            CVodeSetMaxNumSteps(local_20,2000);
            iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78),
                                 (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70),
                                 in_stack_ffffffffffffff6c);
            if (iVar1 == 0) {
              CVodeInit(0,local_20,f,uVar4);
              iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                    in_stack_ffffffffffffff78),
                                   (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff6c);
              if (iVar1 == 0) {
                CVodeSStolerances(local_40,local_38,local_20);
                iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                      in_stack_ffffffffffffff78),
                                     (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                      in_stack_ffffffffffffff70),
                                     in_stack_ffffffffffffff6c);
                if (iVar1 == 0) {
                  local_28 = SUNLinSol_SPGMR(uVar4,1,0,local_18);
                  iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                        in_stack_ffffffffffffff78),
                                       (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                        in_stack_ffffffffffffff70),
                                       in_stack_ffffffffffffff6c);
                  if (iVar1 == 0) {
                    CVodeSetLinearSolver(local_20,local_28,0);
                    iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                          in_stack_ffffffffffffff78),
                                         (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                          in_stack_ffffffffffffff70),
                                         in_stack_ffffffffffffff6c);
                    if (iVar1 == 0) {
                      CVodeSetPreconditioner(local_20,Precond,PSolve);
                      iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78),
                                           (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                            in_stack_ffffffffffffff70),
                                           in_stack_ffffffffffffff6c);
                      if (iVar1 == 0) {
                        printf("\n2-species diurnal advection-diffusion problem\n");
                        if (in_stack_ffffffffffffff7c == 0) {
                          printf("Sensitivity: NO ");
                        }
                        else {
                          __ptr = malloc(8);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
                            *(int *)((long)__ptr + (long)iVar1 * 4) = iVar1;
                          }
                          __ptr_00 = malloc(0x10);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
                            *(sunrealtype *)((long)__ptr_00 + (long)iVar1 * 8) =
                                 local_30->p[*(int *)((long)__ptr + (long)iVar1 * 4)];
                          }
                          y_00 = (N_Vector)N_VCloneVectorArray(2,uVar4);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < 2;
                              in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
                            N_VConst(0,(&y_00->content)[in_stack_ffffffffffffff94]);
                          }
                          CVodeSensInit1(local_20,2,in_stack_ffffffffffffff74,0,y_00);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          CVodeSensEEtolerances(local_20);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          CVodeSetSensErrCon(local_20,in_stack_ffffffffffffff78);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          CVodeSetSensDQMethod(0,local_20,1);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          CVodeSetSensParams(local_20,local_30->p,__ptr_00,__ptr);
                          iVar1 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 != 0) {
                            return 1;
                          }
                          printf("Sensitivity: YES ");
                          if (in_stack_ffffffffffffff74 == 1) {
                            printf("( SIMULTANEOUS +");
                          }
                          else if (in_stack_ffffffffffffff74 == 2) {
                            printf("( STAGGERED +");
                          }
                          else {
                            printf("( STAGGERED1 +");
                          }
                          if (in_stack_ffffffffffffff78 == 0) {
                            printf(" PARTIAL ERROR CONTROL )");
                          }
                          else {
                            printf(" FULL ERROR CONTROL )");
                          }
                        }
                        printf("\n\n");
                        printf(
                              "========================================================================\n"
                              );
                        printf(
                              "     T     Q       H      NST                    Bottom left  Top right \n"
                              );
                        printf(
                              "========================================================================\n"
                              );
                        local_50 = 7200.0;
                        for (iVar1 = 1; sensi_meth_00 = (int)((ulong)in_RSI >> 0x20), iVar1 < 0xd;
                            iVar1 = iVar1 + 1) {
                          CVode(local_50,local_20,uVar4,local_48,1);
                          iVar3 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                in_stack_ffffffffffffff78),
                                               (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                in_stack_ffffffffffffff70),
                                               in_stack_ffffffffffffff6c);
                          sensi_meth_00 = (int)((ulong)in_RSI >> 0x20);
                          if (iVar3 != 0) break;
                          PrintOutput((void *)CONCAT44(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90),(sunrealtype)__ptr
                                      ,y_00);
                          if (in_stack_ffffffffffffff7c != 0) {
                            CVodeGetSens(local_20,local_48,y_00);
                            iVar3 = check_retval((void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                                  in_stack_ffffffffffffff78),
                                                 (char *)CONCAT44(in_stack_ffffffffffffff74,
                                                                  in_stack_ffffffffffffff70),
                                                 in_stack_ffffffffffffff6c);
                            sensi_meth_00 = (int)((ulong)in_RSI >> 0x20);
                            if (iVar3 != 0) break;
                            PrintOutputS((N_Vector *)
                                         CONCAT44(in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70));
                          }
                          printf(
                                "------------------------------------------------------------------------\n"
                                );
                          local_50 = local_50 + 7200.0;
                        }
                        PrintFinalStats(unaff_retaddr,sensi_00,in_EDI,sensi_meth_00);
                        N_VDestroy(uVar4);
                        if (in_stack_ffffffffffffff7c != 0) {
                          N_VDestroyVectorArray(y_00,2);
                          free(__ptr_00);
                          free(__ptr);
                        }
                        FreeUserData((UserData)
                                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
                        CVodeFree(&local_20);
                        SUNLinSolFree(local_28);
                        SUNContext_Free(&local_18);
                        iVar1 = 0;
                      }
                      else {
                        iVar1 = 1;
                      }
                    }
                    else {
                      iVar1 = 1;
                    }
                  }
                  else {
                    iVar1 = 1;
                  }
                }
                else {
                  iVar1 = 1;
                }
              }
              else {
                iVar1 = 1;
              }
            }
            else {
              iVar1 = 1;
            }
          }
          else {
            iVar1 = 1;
          }
        }
        else {
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 1;
      }
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  void* cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype abstol, reltol, t, tout;
  N_Vector y;
  int iout, retval;

  sunrealtype* pbar;
  int is, *plist;
  N_Vector* uS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  pbar      = NULL;
  plist     = NULL;
  uS        = NULL;
  y         = NULL;
  data      = NULL;
  cvode_mem = NULL;
  LS        = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Problem parameters */
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial states */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  SetInitialProfiles(y, data->dx, data->dz);

  /* Tolerances */
  abstol = ATOL;
  reltol = RTOL;

  /* Create CVODES object */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeSetMaxNumSteps(cvode_mem, 2000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate CVODES memory */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create the SUNLinSol_SPGMR linear solver with left
     preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  printf("\n2-species diurnal advection-diffusion problem\n");

  /* Forward sensitivity analysis */
  if (sensi)
  {
    plist = (int*)malloc(NS * sizeof(int));
    if (check_retval((void*)plist, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { plist[is] = is; }

    pbar = (sunrealtype*)malloc(NS * sizeof(sunrealtype));
    if (check_retval((void*)pbar, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { pbar[is] = data->p[plist[is]]; }

    uS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)uS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, uS[is]); }

    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, NULL, uS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    retval = CVodeSetSensDQMethod(cvode_mem, CV_CENTERED, ZERO);
    if (check_retval(&retval, "CVodeSetSensDQMethod", 1)) { return (1); }

    retval = CVodeSetSensParams(cvode_mem, data->p, pbar, plist);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop over output points, call CVode, print results, test for error */

  printf("\n\n");
  printf("====================================================================="
         "===\n");
  printf("     T     Q       H      NST                    Bottom left  Top "
         "right \n");
  printf("====================================================================="
         "===\n");

  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }
    PrintOutput(cvode_mem, t, y);
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, uS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(uS);
    }

    printf("-------------------------------------------------------------------"
           "-----\n");
  }

  /* Print final statistics */
  PrintFinalStats(cvode_mem, sensi, err_con, sensi_meth);

  /* Free memory */
  N_VDestroy(y);
  if (sensi)
  {
    N_VDestroyVectorArray(uS, NS);
    free(pbar);
    free(plist);
  }
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}